

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O0

bool __thiscall miniros::observer::impl::Connections::isEmpty(Connections *this)

{
  mutex_type *pmVar1;
  scoped_lock<std::recursive_mutex> *in_RDI;
  scoped_lock<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::scoped_lock<std::recursive_mutex>::scoped_lock(in_RDI,in_stack_ffffffffffffffd8);
  pmVar1 = in_RDI[4]._M_device;
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x41f3a2);
  return pmVar1 == (mutex_type *)(in_RDI + 1);
}

Assistant:

bool isEmpty() const {
        std::scoped_lock<mutex_t> lock(m_mutex);
        return m_root.m_next == &m_root;
    }